

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * __thiscall
teetime::Image::resize(Image *__return_storage_ptr__,Image *this,size_t width,size_t height)

{
  int iVar1;
  __uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
  output_pixels;
  pointer __p;
  unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_> p;
  
  output_pixels.
  super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>._M_t.
  super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>.
  super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl =
       (__uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>)
       operator_new__(-(ulong)(height * width >> 0x3e != 0) | height * width * 4);
  __return_storage_ptr__->m_width = 0;
  __return_storage_ptr__->m_height = 0;
  __return_storage_ptr__->m_data = (Rgba *)0x0;
  (__return_storage_ptr__->m_filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_filename).field_2;
  (__return_storage_ptr__->m_filename)._M_string_length = 0;
  (__return_storage_ptr__->m_filename).field_2._M_local_buf[0] = '\0';
  p._M_t.super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>.
  _M_t.super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>.
  super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl =
       (__uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
        )(__uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
          )output_pixels.
           super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>
           .super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl;
  iVar1 = stbir_resize_uint8(&this->m_data->r,(int)this->m_width,(int)this->m_height,0,
                             (uchar *)output_pixels.
                                      super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>
                                      .super__Head_base<0UL,_teetime::Image::Rgba_*,_false>.
                                      _M_head_impl,(int)width,(int)height,0,4);
  if (iVar1 != 0) {
    p._M_t.super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>.
    super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl =
         (__uniq_ptr_data<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>,_true,_true>
          )(__uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>)0x0;
    __return_storage_ptr__->m_data =
         (Rgba *)output_pixels.
                 super___uniq_ptr_impl<teetime::Image::Rgba,_std::default_delete<teetime::Image::Rgba[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_teetime::Image::Rgba_*,_std::default_delete<teetime::Image::Rgba[]>_>
                 .super__Head_base<0UL,_teetime::Image::Rgba_*,_false>._M_head_impl;
    __return_storage_ptr__->m_width = width;
    __return_storage_ptr__->m_height = height;
  }
  std::unique_ptr<teetime::Image::Rgba[],_std::default_delete<teetime::Image::Rgba[]>_>::~unique_ptr
            (&p);
  return __return_storage_ptr__;
}

Assistant:

Image Image::resize(size_t width, size_t height) const
{
  unique_ptr<Rgba[]> p(new Rgba[width * height]);

  Image image;

  if (stbir_resize_uint8((const uint8*)m_data, (int)m_width, (int)m_height, 0, (uint8*)p.get(), (int)width, (int)height, 0, 4) != 0)
  {
    image.m_data = p.release();
    image.m_width = width;
    image.m_height = height;
  }

  return image;
}